

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::GetElementIIntIndex
              (Var instance,Var index,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int32 iVar4;
  PropertyQueryFlags val;
  uint32 uVar5;
  undefined4 *puVar6;
  JavascriptArray *arr;
  JavascriptNativeIntArray *arr_00;
  JavascriptNativeFloatArray *arr_01;
  TypedArray<char,_false,_true> *this;
  TypedArray<char,_false,_false> *this_00;
  TypedArray<unsigned_char,_false,_true> *this_01;
  TypedArray<unsigned_char,_false,_false> *this_02;
  TypedArray<unsigned_char,_true,_true> *this_03;
  TypedArray<unsigned_char,_true,_false> *this_04;
  TypedArray<short,_false,_true> *this_05;
  TypedArray<short,_false,_false> *this_06;
  TypedArray<unsigned_short,_false,_true> *this_07;
  TypedArray<unsigned_short,_false,_false> *this_08;
  TypedArray<int,_false,_true> *this_09;
  TypedArray<int,_false,_false> *this_10;
  TypedArray<unsigned_int,_false,_true> *this_11;
  TypedArray<unsigned_int,_false,_false> *this_12;
  TypedArray<float,_false,_true> *this_13;
  TypedArray<float,_false,_false> *this_14;
  TypedArray<double,_false,_true> *this_15;
  TypedArray<double,_false,_false> *this_16;
  Var pvVar7;
  Float64Array *float64Array_1;
  Float64VirtualArray *float64Array;
  int32 indexInt_9;
  Float32Array *float32Array_1;
  Float32VirtualArray *float32Array;
  int32 indexInt_8;
  Uint32Array *uint32Array_1;
  Uint32VirtualArray *uint32Array;
  int32 indexInt_7;
  Int32Array *int32Array_1;
  Int32VirtualArray *int32Array;
  int32 indexInt_6;
  Uint16Array *uint16Array_1;
  Uint16VirtualArray *uint16Array;
  int32 indexInt_5;
  Int16Array *int16Array_1;
  Int16VirtualArray *int16Array;
  int32 indexInt_4;
  Uint8ClampedArray *uint8ClampedArray_1;
  Uint8ClampedVirtualArray *uint8ClampedArray;
  int32 indexInt_3;
  Uint8Array *uint8Array_1;
  Uint8VirtualArray *uint8Array;
  int32 indexInt_2;
  Int8Array *int8Array_1;
  Int8VirtualArray *int8Array;
  Var pvStack_70;
  int32 indexInt_1;
  Var result_3;
  JavascriptString *string;
  Var pvStack_58;
  charcount_t indexInt;
  Var result_2;
  Var result_1;
  Var result;
  ScriptContext *scriptContext_local;
  Var index_local;
  Var instance_local;
  Var local_20;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  result = scriptContext;
  scriptContext_local = (ScriptContext *)index;
  index_local = instance;
  bVar2 = TaggedInt::Is(index);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xe76,"(TaggedInt::Is(index))","TaggedInt::Is(index)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  local_20 = index_local;
  if (index_local == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = TaggedInt::Is(local_20);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(local_20);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(local_20);
      if (pRStack_10 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_14 = RecyclableObject::GetTypeId(pRStack_10);
      if ((0x57 < (int)local_14) && (BVar3 = RecyclableObject::IsExternal(pRStack_10), BVar3 == 0))
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_18 = local_14;
    }
  }
  switch(local_18) {
  case TypeIds_String:
    string._4_4_ = TaggedInt::ToUInt32(scriptContext_local);
    result_3 = UnsafeVarTo<Js::JavascriptString>(index_local);
    val = JavascriptString::GetItemQuery
                    ((JavascriptString *)result_3,index_local,string._4_4_,&stack0xffffffffffffff90,
                     (ScriptContext *)result);
    BVar3 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
    if (BVar3 != 0) {
      return pvStack_70;
    }
    break;
  default:
    break;
  case TypeIds_Array:
    arr = UnsafeVarTo<Js::JavascriptArray>(index_local);
    iVar4 = TaggedInt::ToInt32(scriptContext_local);
    BVar3 = OP_GetElementI_ArrayFastPath<Js::JavascriptArray>
                      (arr,iVar4,&result_1,(ScriptContext *)result);
    if (BVar3 != 0) {
      return result_1;
    }
    break;
  case TypeIds_NativeIntArray:
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(index_local);
    arr_00 = UnsafeVarTo<Js::JavascriptNativeIntArray>(index_local);
    iVar4 = TaggedInt::ToInt32(scriptContext_local);
    BVar3 = OP_GetElementI_ArrayFastPath<Js::JavascriptNativeIntArray>
                      (arr_00,iVar4,&result_2,(ScriptContext *)result);
    if (BVar3 != 0) {
      return result_2;
    }
    break;
  case TypeIds_ArrayLast:
    arr_01 = UnsafeVarTo<Js::JavascriptNativeFloatArray>(index_local);
    iVar4 = TaggedInt::ToInt32(scriptContext_local);
    BVar3 = OP_GetElementI_ArrayFastPath<Js::JavascriptNativeFloatArray>
                      (arr_01,iVar4,&stack0xffffffffffffffa8,(ScriptContext *)result);
    if (BVar3 != 0) {
      return pvStack_58;
    }
    break;
  case TypeIds_Int8Array:
    uVar5 = TaggedInt::ToInt32(scriptContext_local);
    bVar2 = VirtualTableInfo<Js::TypedArray<char,_false,_true>_>::HasVirtualTable(index_local);
    if (bVar2) {
      this = UnsafeVarTo<Js::TypedArray<char,false,true>>(index_local);
      if (-1 < (int)uVar5) {
        pvVar7 = TypedArray<char,_false,_true>::DirectGetItem(this,uVar5);
        return pvVar7;
      }
    }
    else {
      bVar2 = VirtualTableInfo<Js::TypedArray<char,_false,_false>_>::HasVirtualTable(index_local);
      if ((bVar2) &&
         (this_00 = UnsafeVarTo<Js::TypedArray<char,false,false>>(index_local), -1 < (int)uVar5)) {
        pvVar7 = TypedArray<char,_false,_false>::DirectGetItem(this_00,uVar5);
        return pvVar7;
      }
    }
    break;
  case TypeIds_Uint8Array:
    uVar5 = TaggedInt::ToInt32(scriptContext_local);
    bVar2 = VirtualTableInfo<Js::TypedArray<unsigned_char,_false,_true>_>::HasVirtualTable
                      (index_local);
    if (bVar2) {
      this_01 = UnsafeVarTo<Js::TypedArray<unsigned_char,false,true>>(index_local);
      if (-1 < (int)uVar5) {
        pvVar7 = TypedArray<unsigned_char,_false,_true>::DirectGetItem(this_01,uVar5);
        return pvVar7;
      }
    }
    else {
      bVar2 = VirtualTableInfo<Js::TypedArray<unsigned_char,_false,_false>_>::HasVirtualTable
                        (index_local);
      if ((bVar2) &&
         (this_02 = UnsafeVarTo<Js::TypedArray<unsigned_char,false,false>>(index_local),
         -1 < (int)uVar5)) {
        pvVar7 = TypedArray<unsigned_char,_false,_false>::DirectGetItem(this_02,uVar5);
        return pvVar7;
      }
    }
    break;
  case TypeIds_Uint8ClampedArray:
    uVar5 = TaggedInt::ToInt32(scriptContext_local);
    bVar2 = VirtualTableInfo<Js::TypedArray<unsigned_char,_true,_true>_>::HasVirtualTable
                      (index_local);
    if (bVar2) {
      this_03 = UnsafeVarTo<Js::TypedArray<unsigned_char,true,true>>(index_local);
      if (-1 < (int)uVar5) {
        pvVar7 = TypedArray<unsigned_char,_true,_true>::DirectGetItem(this_03,uVar5);
        return pvVar7;
      }
    }
    else {
      bVar2 = VirtualTableInfo<Js::TypedArray<unsigned_char,_true,_false>_>::HasVirtualTable
                        (index_local);
      if ((bVar2) &&
         (this_04 = UnsafeVarTo<Js::TypedArray<unsigned_char,true,false>>(index_local),
         -1 < (int)uVar5)) {
        pvVar7 = TypedArray<unsigned_char,_true,_false>::DirectGetItem(this_04,uVar5);
        return pvVar7;
      }
    }
    break;
  case TypeIds_Int16Array:
    uVar5 = TaggedInt::ToInt32(scriptContext_local);
    bVar2 = VirtualTableInfo<Js::TypedArray<short,_false,_true>_>::HasVirtualTable(index_local);
    if (bVar2) {
      this_05 = UnsafeVarTo<Js::TypedArray<short,false,true>>(index_local);
      if (-1 < (int)uVar5) {
        pvVar7 = TypedArray<short,_false,_true>::DirectGetItem(this_05,uVar5);
        return pvVar7;
      }
    }
    else {
      bVar2 = VirtualTableInfo<Js::TypedArray<short,_false,_false>_>::HasVirtualTable(index_local);
      if ((bVar2) &&
         (this_06 = UnsafeVarTo<Js::TypedArray<short,false,false>>(index_local), -1 < (int)uVar5)) {
        pvVar7 = TypedArray<short,_false,_false>::DirectGetItem(this_06,uVar5);
        return pvVar7;
      }
    }
    break;
  case TypeIds_Uint16Array:
    uVar5 = TaggedInt::ToInt32(scriptContext_local);
    bVar2 = VirtualTableInfo<Js::TypedArray<unsigned_short,_false,_true>_>::HasVirtualTable
                      (index_local);
    if (bVar2) {
      this_07 = UnsafeVarTo<Js::TypedArray<unsigned_short,false,true>>(index_local);
      if (-1 < (int)uVar5) {
        pvVar7 = TypedArray<unsigned_short,_false,_true>::DirectGetItem(this_07,uVar5);
        return pvVar7;
      }
    }
    else {
      bVar2 = VirtualTableInfo<Js::TypedArray<unsigned_short,_false,_false>_>::HasVirtualTable
                        (index_local);
      if ((bVar2) &&
         (this_08 = UnsafeVarTo<Js::TypedArray<unsigned_short,false,false>>(index_local),
         -1 < (int)uVar5)) {
        pvVar7 = TypedArray<unsigned_short,_false,_false>::DirectGetItem(this_08,uVar5);
        return pvVar7;
      }
    }
    break;
  case TypeIds_Int32Array:
    uVar5 = TaggedInt::ToInt32(scriptContext_local);
    bVar2 = VirtualTableInfo<Js::TypedArray<int,_false,_true>_>::HasVirtualTable(index_local);
    if (bVar2) {
      this_09 = UnsafeVarTo<Js::TypedArray<int,false,true>>(index_local);
      if (-1 < (int)uVar5) {
        pvVar7 = TypedArray<int,_false,_true>::DirectGetItem(this_09,uVar5);
        return pvVar7;
      }
    }
    else {
      bVar2 = VirtualTableInfo<Js::TypedArray<int,_false,_false>_>::HasVirtualTable(index_local);
      if ((bVar2) &&
         (this_10 = UnsafeVarTo<Js::TypedArray<int,false,false>>(index_local), -1 < (int)uVar5)) {
        pvVar7 = TypedArray<int,_false,_false>::DirectGetItem(this_10,uVar5);
        return pvVar7;
      }
    }
    break;
  case TypeIds_Uint32Array:
    uVar5 = TaggedInt::ToInt32(scriptContext_local);
    bVar2 = VirtualTableInfo<Js::TypedArray<unsigned_int,_false,_true>_>::HasVirtualTable
                      (index_local);
    if (bVar2) {
      this_11 = UnsafeVarTo<Js::TypedArray<unsigned_int,false,true>>(index_local);
      if (-1 < (int)uVar5) {
        pvVar7 = TypedArray<unsigned_int,_false,_true>::DirectGetItem(this_11,uVar5);
        return pvVar7;
      }
    }
    else {
      bVar2 = VirtualTableInfo<Js::TypedArray<unsigned_int,_false,_false>_>::HasVirtualTable
                        (index_local);
      if ((bVar2) &&
         (this_12 = UnsafeVarTo<Js::TypedArray<unsigned_int,false,false>>(index_local),
         -1 < (int)uVar5)) {
        pvVar7 = TypedArray<unsigned_int,_false,_false>::DirectGetItem(this_12,uVar5);
        return pvVar7;
      }
    }
    break;
  case TypeIds_Float32Array:
    uVar5 = TaggedInt::ToInt32(scriptContext_local);
    bVar2 = VirtualTableInfo<Js::TypedArray<float,_false,_true>_>::HasVirtualTable(index_local);
    if (bVar2) {
      this_13 = UnsafeVarTo<Js::TypedArray<float,false,true>>(index_local);
      if (-1 < (int)uVar5) {
        pvVar7 = TypedArray<float,_false,_true>::DirectGetItem(this_13,uVar5);
        return pvVar7;
      }
    }
    else {
      bVar2 = VirtualTableInfo<Js::TypedArray<float,_false,_false>_>::HasVirtualTable(index_local);
      if ((bVar2) &&
         (this_14 = UnsafeVarTo<Js::TypedArray<float,false,false>>(index_local), -1 < (int)uVar5)) {
        pvVar7 = TypedArray<float,_false,_false>::DirectGetItem(this_14,uVar5);
        return pvVar7;
      }
    }
    break;
  case TypeIds_Float64Array:
    uVar5 = TaggedInt::ToInt32(scriptContext_local);
    bVar2 = VirtualTableInfo<Js::TypedArray<double,_false,_true>_>::HasVirtualTable(index_local);
    if (bVar2) {
      this_15 = UnsafeVarTo<Js::TypedArray<double,false,true>>(index_local);
      if (-1 < (int)uVar5) {
        pvVar7 = TypedArray<double,_false,_true>::DirectGetItem(this_15,uVar5);
        return pvVar7;
      }
    }
    else {
      bVar2 = VirtualTableInfo<Js::TypedArray<double,_false,_false>_>::HasVirtualTable(index_local);
      if ((bVar2) &&
         (this_16 = UnsafeVarTo<Js::TypedArray<double,false,false>>(index_local), -1 < (int)uVar5))
      {
        pvVar7 = TypedArray<double,_false,_false>::DirectGetItem(this_16,uVar5);
        return pvVar7;
      }
    }
  }
  pvVar7 = GetElementIHelper(index_local,scriptContext_local,index_local,(ScriptContext *)result);
  return pvVar7;
}

Assistant:

Var JavascriptOperators::GetElementIIntIndex(_In_ Var instance, _In_ Var index, _In_ ScriptContext* scriptContext)
    {
        Assert(TaggedInt::Is(index));

        switch (JavascriptOperators::GetTypeId(instance))
        {
        case TypeIds_Array: //fast path for array
        {
            Var result;
            if (OP_GetElementI_ArrayFastPath(UnsafeVarTo<JavascriptArray>(instance), TaggedInt::ToInt32(index), &result, scriptContext))
            {
                return result;
            }
            break;
        }
        case TypeIds_NativeIntArray:
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
            Var result;
            if (OP_GetElementI_ArrayFastPath(UnsafeVarTo<JavascriptNativeIntArray>(instance), TaggedInt::ToInt32(index), &result, scriptContext))
            {
                return result;
            }
            break;
        }
        case TypeIds_NativeFloatArray:
        {
            Var result;
            if (OP_GetElementI_ArrayFastPath(UnsafeVarTo<JavascriptNativeFloatArray>(instance), TaggedInt::ToInt32(index), &result, scriptContext))
            {
                return result;
            }
            break;
        }

        case TypeIds_String: // fast path for string
        {
            charcount_t indexInt = TaggedInt::ToUInt32(index);
            JavascriptString* string = UnsafeVarTo<JavascriptString>(instance);
            Var result;
            if (JavascriptConversion::PropertyQueryFlagsToBoolean(string->JavascriptString::GetItemQuery(instance, indexInt, &result, scriptContext)))
            {
                return result;
            }
            break;
        }

        case TypeIds_Int8Array:
        {
            // The typed array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Int8VirtualArray>::HasVirtualTable(instance))
            {
                Int8VirtualArray* int8Array = UnsafeVarTo<Int8VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return int8Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Int8Array>::HasVirtualTable(instance))
            {
                Int8Array* int8Array = UnsafeVarTo<Int8Array>(instance);
                if (indexInt >= 0)
                {
                    return int8Array->DirectGetItem(indexInt);
                }
            }
            break;
        }

        case TypeIds_Uint8Array:
        {
            // The typed array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Uint8VirtualArray>::HasVirtualTable(instance))
            {
                Uint8VirtualArray* uint8Array = UnsafeVarTo<Uint8VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return uint8Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Uint8Array>::HasVirtualTable(instance))
            {
                Uint8Array* uint8Array = UnsafeVarTo<Uint8Array>(instance);
                if (indexInt >= 0)
                {
                    return uint8Array->DirectGetItem(indexInt);
                }
            }
            break;
        }

        case TypeIds_Uint8ClampedArray:
        {
            // The typed array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Uint8ClampedVirtualArray>::HasVirtualTable(instance))
            {
                Uint8ClampedVirtualArray* uint8ClampedArray = UnsafeVarTo<Uint8ClampedVirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return uint8ClampedArray->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Uint8ClampedArray>::HasVirtualTable(instance))
            {
                Uint8ClampedArray* uint8ClampedArray = UnsafeVarTo<Uint8ClampedArray>(instance);
                if (indexInt >= 0)
                {
                    return uint8ClampedArray->DirectGetItem(indexInt);
                }
            }
            break;
        }

        case TypeIds_Int16Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);

            if (VirtualTableInfo<Int16VirtualArray>::HasVirtualTable(instance))
            {
                Int16VirtualArray* int16Array = UnsafeVarTo<Int16VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return int16Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Int16Array>::HasVirtualTable(instance))
            {
                Int16Array* int16Array = UnsafeVarTo<Int16Array>(instance);
                if (indexInt >= 0)
                {
                    return int16Array->DirectGetItem(indexInt);
                }
            }
            break;
        }

        case TypeIds_Uint16Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);

            if (VirtualTableInfo<Uint16VirtualArray>::HasVirtualTable(instance))
            {
                Uint16VirtualArray* uint16Array = UnsafeVarTo<Uint16VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return uint16Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Uint16Array>::HasVirtualTable(instance))
            {
                Uint16Array* uint16Array = UnsafeVarTo<Uint16Array>(instance);
                if (indexInt >= 0)
                {
                    return uint16Array->DirectGetItem(indexInt);
                }
            }
            break;
        }
        case TypeIds_Int32Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Int32VirtualArray>::HasVirtualTable(instance))
            {
                Int32VirtualArray* int32Array = UnsafeVarTo<Int32VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return int32Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Int32Array>::HasVirtualTable(instance))
            {
                Int32Array* int32Array = UnsafeVarTo<Int32Array>(instance);
                if (indexInt >= 0)
                {
                    return int32Array->DirectGetItem(indexInt);
                }
            }
            break;

        }
        case TypeIds_Uint32Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Uint32VirtualArray>::HasVirtualTable(instance))
            {
                Uint32VirtualArray* uint32Array = UnsafeVarTo<Uint32VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return uint32Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Uint32Array>::HasVirtualTable(instance))
            {
                Uint32Array* uint32Array = UnsafeVarTo<Uint32Array>(instance);
                if (indexInt >= 0)
                {
                    return uint32Array->DirectGetItem(indexInt);
                }
            }
            break;
        }
        case TypeIds_Float32Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);

            if (VirtualTableInfo<Float32VirtualArray>::HasVirtualTable(instance))
            {
                Float32VirtualArray* float32Array = UnsafeVarTo<Float32VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return float32Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Float32Array>::HasVirtualTable(instance))
            {
                Float32Array* float32Array = UnsafeVarTo<Float32Array>(instance);
                if (indexInt >= 0)
                {
                    return float32Array->DirectGetItem(indexInt);
                }
            }
            break;
        }
        case TypeIds_Float64Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Float64VirtualArray>::HasVirtualTable(instance))
            {
                Float64VirtualArray* float64Array = UnsafeVarTo<Float64VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return float64Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Float64Array>::HasVirtualTable(instance))
            {
                Float64Array* float64Array = UnsafeVarTo<Float64Array>(instance);
                if (indexInt >= 0)
                {
                    return float64Array->DirectGetItem(indexInt);
                }
            }
            break;
        }

        default:
            break;
        }
        return JavascriptOperators::GetElementIHelper(instance, index, instance, scriptContext);
    }